

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int EVdfg_perform_act_on_state(EVdfg_configuration config,EVdfg_config_action act,int build_queue)

{
  int iVar1;
  uint uVar2;
  attr_list p_Var3;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  EVdfg_config_action act_02;
  EVdfg_config_action act_03;
  EVdfg_config_action act_04;
  bool bVar4;
  int iVar5;
  char **ppcVar6;
  EVdfg_stone_state p_Var7;
  EVdfg_stone_state p_Var8;
  int *piVar9;
  EVdfg_stone_state p_Var10;
  EVdfg_stone_state *pp_Var11;
  ulong uVar12;
  ulong uVar13;
  size_t size;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int local_6c;
  EVconfig_action_type local_60;
  EVdfg_config_action dact;
  
  uVar17 = (undefined4)dact.u._8_8_;
  uVar18 = (undefined4)((ulong)dact.u._8_8_ >> 0x20);
  p_Var3 = act.u._0_8_;
  switch((ulong)act.type) {
  case 0:
  case 10:
  case 0xb:
    printf("Bad action in perform_act_on_state %s (%d)\n",ACT_string[act.type]);
    return 0;
  case 1:
    bVar4 = true;
    goto LAB_0013ef48;
  case 2:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var10->action == (char *)0x0) {
      p_Var10->action = (char *)p_Var3;
      return 1;
    }
    if (p_Var10->extra_actions == (char **)0x0) {
      ppcVar6 = (char **)INT_CMmalloc(8);
    }
    else {
      ppcVar6 = (char **)INT_CMrealloc(p_Var10->extra_actions,(long)p_Var10->action_count << 3);
    }
    p_Var10->extra_actions = ppcVar6;
    iVar5 = p_Var10->action_count;
    ppcVar6[(long)iVar5 + -1] = (char *)p_Var3;
    p_Var10->action_count = iVar5 + 1;
    break;
  case 3:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    *(attr_list *)&p_Var10->period_secs = p_Var3;
    break;
  case 4:
    p_Var10 = find_stone_state(act.stone_id,config);
    p_Var7 = find_stone_state(act.u.period.usecs,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    lVar16 = (long)act.u.period.secs;
    if (p_Var10->out_count == 0) {
      size = lVar16 * 4 + 4;
      piVar9 = (int *)INT_CMmalloc(size);
      p_Var10->out_links = piVar9;
      iVar5 = 0;
LAB_0013f20e:
      memset(piVar9,iVar5,size);
      p_Var10->out_count = act.u.period.secs + 1;
    }
    else if (p_Var10->out_count <= act.u.period.secs) {
      piVar9 = (int *)INT_CMrealloc(p_Var10->out_links,lVar16 * 4 + 4);
      p_Var10->out_links = piVar9;
      piVar9 = piVar9 + p_Var10->out_count;
      size = ((long)(act.u.period.secs + 1) - (long)p_Var10->out_count) * 4;
      iVar5 = 0xff;
      goto LAB_0013f20e;
    }
    uVar2 = p_Var7->in_count;
    uVar12 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    bVar4 = false;
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      if (p_Var7->in_links[uVar12] == act.stone_id) {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      if (uVar2 == 0) {
        piVar9 = (int *)INT_CMmalloc(4);
        p_Var7->in_links = piVar9;
        *piVar9 = 0;
        iVar5 = 1;
      }
      else {
        piVar9 = (int *)INT_CMrealloc(p_Var7->in_links,(long)(int)uVar2 * 4 + 4);
        p_Var7->in_links = piVar9;
        piVar9[p_Var7->in_count] = 0;
        iVar5 = p_Var7->in_count + 1;
      }
      p_Var7->in_count = iVar5;
      p_Var7->in_links[(long)iVar5 + -1] = act.stone_id;
    }
    piVar9 = p_Var10->out_links;
    if (build_queue == 0) {
      piVar9[lVar16] = act.u.period.usecs;
      return 1;
    }
    if (piVar9[lVar16] != -1) {
      dact.u.period.secs = act.u.period.secs;
      act_03.stone_id = p_Var10->stone_id;
      act_03.type = 6;
      act_03.node_for_action = p_Var10->node;
      act_03._12_4_ = dact._12_4_;
      act_03.u.period.secs = act.u.period.secs;
      act_03.u.period.usecs = dact.u.period.usecs;
      act_03.u.bridge.target_id = uVar17;
      act_03.u._12_4_ = uVar18;
      EVdfg_perform_act_on_state(config,act_03,1);
      piVar9 = p_Var10->out_links;
    }
    piVar9[lVar16] = act.u.period.usecs;
    if (p_Var10->condition == EVstone_Deployed) {
      act_04.stone_id = p_Var10->stone_id;
      act_04.type = 10;
      act_04.node_for_action = p_Var10->node;
      act_04._12_4_ = dact._12_4_;
      act_04.u.period.secs = dact.u.period.secs;
      act_04.u.period.usecs = dact.u.period.usecs;
      act_04.u.bridge.target_id = uVar17;
      act_04.u._12_4_ = uVar18;
      EVdfg_add_act_to_queue(config,act_04);
      p_Var10->condition = EVstone_Frozen;
    }
    goto LAB_0013f2c6;
  case 5:
    p_Var10 = find_stone_state(act.stone_id,config);
    p_Var7 = find_stone_state(act.u.period.usecs,config);
    uVar2 = p_Var10->out_count;
    uVar12 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    bVar4 = false;
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      if (p_Var10->out_links[uVar12] == act.u.period.usecs) {
        bVar4 = true;
      }
    }
    if (bVar4) {
      return 0;
    }
    if (uVar2 == 0) {
      piVar9 = (int *)INT_CMmalloc(4);
      p_Var10->out_links = piVar9;
      memset(piVar9,0,(long)p_Var10->out_count * 4 + 4);
      piVar9 = p_Var10->out_links;
    }
    else {
      piVar9 = (int *)INT_CMrealloc(p_Var10->out_links,(long)(int)uVar2 * 4 + 4);
      p_Var10->out_links = piVar9;
    }
    iVar5 = p_Var10->out_count;
    p_Var10->out_count = iVar5 + 1;
    piVar9[iVar5] = act.u.period.usecs;
    uVar2 = p_Var7->in_count;
    uVar12 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    bVar4 = false;
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      if (p_Var7->in_links[uVar12] == act.stone_id) {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      if (uVar2 == 0) {
        piVar9 = (int *)INT_CMmalloc(4);
        p_Var7->in_links = piVar9;
        *piVar9 = 0;
        iVar5 = 1;
      }
      else {
        piVar9 = (int *)INT_CMrealloc(p_Var7->in_links,(long)(int)uVar2 * 4 + 4);
        p_Var7->in_links = piVar9;
        piVar9[p_Var7->in_count] = 0;
        iVar5 = p_Var7->in_count + 1;
      }
      p_Var7->in_count = iVar5;
      p_Var7->in_links[(long)iVar5 + -1] = act.stone_id;
    }
    break;
  case 6:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var10->out_count <= act.u.period.secs) {
      return 0;
    }
    piVar9 = p_Var10->out_links;
    if (piVar9[act.u.period.secs] == -1) {
      return 0;
    }
    p_Var7 = find_stone_state(piVar9[act.u.period.secs],config);
    if (p_Var7 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var7->bridge_stone != 0) {
      act_01.stone_id = p_Var7->stone_id;
      act_01.type = 9;
      act_01.node_for_action = dact.node_for_action;
      act_01._12_4_ = dact._12_4_;
      act_01.u.period.secs = dact.u.period.secs;
      act_01.u.period.usecs = dact.u.period.usecs;
      act_01.u.bridge.target_id = uVar17;
      act_01.u._12_4_ = uVar18;
      EVdfg_perform_act_on_state(config,act_01,build_queue);
      piVar9 = p_Var10->out_links;
    }
    piVar9[act.u.period.secs] = -1;
    break;
  case 7:
    p_Var10 = find_stone_state(act.stone_id,config);
    p_Var7 = find_stone_state(act.u.period.usecs,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    iVar5 = p_Var10->out_count;
    if (iVar5 <= act.u.period.secs) {
      return 0;
    }
    local_6c = act.u.period.secs;
    local_60 = ACT_unlink_dest;
    iVar14 = -1;
    iVar15 = 0;
    for (lVar16 = 0; lVar16 < iVar5; lVar16 = lVar16 + 1) {
      piVar9 = p_Var10->out_links;
      iVar1 = p_Var7->stone_id;
      if (piVar9[lVar16] == iVar1) {
        memmove(piVar9 + lVar16,piVar9 + lVar16 + 1,(long)(iVar5 + iVar14) << 2);
        iVar15 = iVar15 + 1;
      }
      else {
        p_Var8 = find_stone_state(piVar9[lVar16],config);
        if ((p_Var8->bridge_stone != 0) && (*p_Var8->out_links == iVar1)) {
          act_00.stone_id = p_Var8->stone_id;
          act_00.type = 9;
          act_00.node_for_action = dact.node_for_action;
          act_00._12_4_ = dact._12_4_;
          act_00.u.period.secs = dact.u.period.secs;
          act_00.u.period.usecs = dact.u.period.usecs;
          act_00.u.bridge.target_id = uVar17;
          act_00.u._12_4_ = uVar18;
          EVdfg_perform_act_on_state(config,act_00,build_queue);
          memmove(p_Var10->out_links + lVar16,p_Var10->out_links + lVar16 + 1,
                  (long)(p_Var10->out_count + iVar14) << 2);
          iVar15 = iVar15 + 1;
          local_6c = (int)lVar16;
          local_60 = ACT_unlink_port;
        }
      }
      iVar5 = p_Var10->out_count;
      iVar14 = iVar14 + -1;
    }
    act.u.period.secs = local_6c;
    act.type = local_60;
    if (iVar15 == 0) {
      return 0;
    }
    break;
  case 8:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var10->attrs != (attr_list)0x0) {
      free_attr_list();
    }
    p_Var10->attrs = p_Var3;
    break;
  case 9:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    break;
  case 0xc:
    p_Var10 = find_stone_state(act.stone_id,config);
    if (p_Var10 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    p_Var10->node = act.u.period.secs;
    break;
  case 0xd:
    bVar4 = false;
LAB_0013ef48:
    p_Var10 = (EVdfg_stone_state)INT_CMmalloc(0x68);
    p_Var10->node = -1;
    p_Var10->bridge_stone = 0;
    p_Var10->attrs = (attr_list)0x0;
    p_Var10->period_secs = -1;
    p_Var10->period_usecs = -1;
    p_Var10->out_count = 0;
    p_Var10->out_links = (int *)0x0;
    p_Var10->in_count = 0;
    p_Var10->in_links = (int *)0x0;
    p_Var10->action_count = 1;
    p_Var10->extra_actions = (char **)0x0;
    p_Var10->bridge_target = -1;
    p_Var10->condition = EVstone_Undeployed;
    p_Var10->fetched_events = (EVevent_list)0x0;
    if (!bVar4) {
      p_Var10->bridge_stone = 1;
      p_Var10->bridge_target = act.u.bridge.target_id;
      p_Var10->node = act.node_for_action;
    }
    p_Var10->stone_id = act.stone_id;
    p_Var10->action = (char *)p_Var3;
    if ((long)config->stone_count == 0) {
      pp_Var11 = (EVdfg_stone_state *)INT_CMmalloc(8);
    }
    else {
      pp_Var11 = (EVdfg_stone_state *)
                 INT_CMrealloc(config->stones,(long)config->stone_count * 8 + 8);
    }
    config->stones = pp_Var11;
    iVar5 = config->stone_count;
    config->stone_count = iVar5 + 1;
    pp_Var11[iVar5] = p_Var10;
    if (build_queue == 0) {
      return 1;
    }
    goto LAB_0013f2c6;
  default:
    printf("Bad action in perform_act_on_state %d\n",(ulong)act.type);
    return 0;
  }
  if (build_queue != 0) {
LAB_0013f2c6:
    act_02.stone_id = act.stone_id;
    act_02.type = act.type;
    act_02.node_for_action = act.node_for_action;
    act_02._12_4_ = act._12_4_;
    act_02.u.period.secs = act.u.period.secs;
    act_02.u.period.usecs = act.u.period.usecs;
    act_02.u.bridge.target_id = act.u.bridge.target_id;
    act_02.u._12_4_ = act.u._12_4_;
    EVdfg_add_act_to_queue(config,act_02);
  }
  return 1;
}

Assistant:

int
EVdfg_perform_act_on_state(EVdfg_configuration config, EVdfg_config_action act, int build_queue)
{
    int bridge = 0;
    switch(act.type) {
    case ACT_create_bridge:
	bridge = 1;
	/* falling through */
    case ACT_create: {
	EVdfg_stone_state stone = malloc(sizeof(*stone));
	stone->node = -1;
	stone->bridge_stone = 0;
	stone->attrs = NULL;
	stone->period_secs = -1;
	stone->period_usecs = -1;
	stone->out_count = 0;
	stone->out_links = NULL;
	stone->in_count = 0;
	stone->in_links = NULL;
	stone->action_count = 1;
	stone->extra_actions = NULL;
	stone->condition = EVstone_Undeployed;
	stone->bridge_target = -1;
	stone->fetched_events = NULL;
	if (bridge) {
	    stone->bridge_stone = 1;
	    stone->stone_id = act.stone_id;
	    stone->action = act.u.bridge.action;
	    stone->bridge_target = act.u.bridge.target_id;
	    stone->node = act.node_for_action;
	} else {
	    stone->stone_id = act.stone_id;
	    stone->action = act.u.create.action;
	}
	if (config->stone_count == 0) {
	    config->stones = malloc(sizeof(config->stones[0]));
	} else {
	    config->stones = realloc(config->stones, 
				     sizeof(config->stones[0]) * (config->stone_count + 1));
	}
	config->stones[config->stone_count++] = stone;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_add_action: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (stone->action == NULL) {
	    stone->action = act.u.create.action;
	    break;
	}
	if (stone->extra_actions == NULL) {
	    stone->extra_actions = malloc(sizeof(stone->extra_actions[0]));
	} else {
	    stone->extra_actions = realloc(stone->extra_actions,
					   stone->action_count * sizeof(stone->extra_actions[0]));
	}
	stone->extra_actions[stone->action_count - 1] = act.u.create.action;
	stone->action_count++;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_set_auto_period: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	stone->period_secs = act.u.period.secs;
	stone->period_usecs = act.u.period.usecs;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_link_port: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dst = find_stone_state(act.u.link.dest_id, config);
	int i, in_link_found;
	if (!src) {
	    return 0;
	}
	if (src->out_count == 0) {
	    src->out_links = malloc(sizeof(src->out_links[0]) * (act.u.link.port+1));
	    memset(src->out_links, 0, sizeof(src->out_links[0]) * (act.u.link.port+1));
	    src->out_count = act.u.link.port + 1;
	} else if (src->out_count < act.u.link.port + 1) {
	    src->out_links = realloc(src->out_links,
				     sizeof(src->out_links[0]) * (act.u.link.port+1));
	    memset(&src->out_links[src->out_count], -1, sizeof(src->out_links[0]) * (act.u.link.port+1-src->out_count));
	    src->out_count = act.u.link.port + 1;
	}
	in_link_found =  0;
	for (i=0; i < dst->in_count; i++) {
	    if (dst->in_links[i] == act.stone_id) in_link_found = 1;
	}
	if (in_link_found == 0) {
	    if (dst->in_count == 0) {
		dst->in_links = malloc(sizeof(dst->in_links[0]));
		memset(dst->in_links, 0, sizeof(dst->in_links[0]));
		dst->in_count = 1;
	    } else {
		dst->in_links = realloc(dst->in_links,
					sizeof(dst->in_links[0]) * (dst->in_count+1));
		memset(&dst->in_links[dst->in_count], 0, sizeof(dst->in_links[0]) * (dst->in_count+1-dst->in_count));
		dst->in_count++;
	    }
	    dst->in_links[dst->in_count - 1] = act.stone_id;
	}
	if (build_queue) {
	    if (src->out_links[act.u.link.port] != -1) {
		EVdfg_config_action dact;
		dact.type = ACT_unlink_port;
		dact.node_for_action = src->node;
		dact.stone_id = src->stone_id;
		dact.u.link.port = act.u.link.port;
		EVdfg_perform_act_on_state(config, dact, build_queue);
	    }
	}
	src->out_links[act.u.link.port] = act.u.link.dest_id;
	if (build_queue) {
	    if (src->condition == EVstone_Deployed) {
		EVdfg_config_action fact;
		fact.type = ACT_freeze;
		fact.stone_id = src->stone_id;
		fact.node_for_action = src->node;
		EVdfg_add_act_to_queue(config, fact);
		src->condition = EVstone_Frozen;
	    }
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_link_dest: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dst = find_stone_state(act.u.link.dest_id, config);
	int i, in_link_found, out_link_found =  0;
	for (i=0; i < src->out_count; i++) {
	    if (src->out_links[i] == act.u.link.dest_id) out_link_found = 1;
	}
	if (out_link_found) {
	    return 0;
	}
	if (!src) {
	    return 0;
	}
	if (src->out_count == 0) {
	    src->out_links = malloc(sizeof(src->out_links[0]) * (src->out_count+1));
	    memset(src->out_links, 0, sizeof(src->out_links[0]) * (src->out_count+1));
	    src->out_count++;
	} else {
	    src->out_links = realloc(src->out_links,
				     sizeof(src->out_links[0]) * (src->out_count+1));
	    src->out_count++;
	}
	src->out_links[src->out_count-1] = act.u.link.dest_id;
	in_link_found = 0;
	for (i=0; i < dst->in_count; i++) {
	    if (dst->in_links[i] == act.stone_id) in_link_found = 1;
	}
	if (in_link_found == 0) {
	    if (dst->in_count == 0) {
		dst->in_links = malloc(sizeof(dst->in_links[0]));
		memset(dst->in_links, 0, sizeof(dst->in_links[0]));
		dst->in_count = 1;
	    } else {
		dst->in_links = realloc(dst->in_links,
					sizeof(dst->in_links[0]) * (dst->in_count+1));
		memset(&dst->in_links[dst->in_count], 0, sizeof(dst->in_links[0]) * (dst->in_count+1-dst->in_count));
		dst->in_count++;
	    }
	    dst->in_links[dst->in_count - 1] = act.stone_id;
	}
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_unlink_port: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dest;
	if (!src) {
	    return 0;
	}
	if (src->out_count <= act.u.link.port) return 0;
	if (src->out_links[act.u.link.port] == -1) {
	    /* unassigned, error to unlink */
	    return 0;
	}
	dest = find_stone_state(src->out_links[act.u.link.port], config);
	if (!dest) {
	    return 0;
	}
	if (dest->bridge_stone) {
	    /* this stone only exists because of this link, destroy it */
	    EVdfg_config_action dact;
	    dact.type = ACT_destroy;
	    dact.stone_id = dest->stone_id;
	    EVdfg_perform_act_on_state(config, dact, build_queue);
	}
	src->out_links[act.u.link.port] = -1;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_unlink_dest: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dest = find_stone_state(act.u.link.dest_id, config);
	int found = 0;
	int i = 0;
	if (!src) {
	    return 0;
	}
	if (src->out_count <= act.u.link.port) return 0;
	for (i=0; i < src->out_count; i++) {
	    if (src->out_links[i] == dest->stone_id) {
		/* remove this, move remaining down */
		memmove(&src->out_links[i], &src->out_links[i+1], 
			sizeof(src->out_links[0]) * (src->out_count - i - 1));
		found++;
	    } else {
		EVdfg_stone_state possible_bridge = find_stone_state(src->out_links[i], config);
		if (possible_bridge->bridge_stone && (possible_bridge->out_links[0] == dest->stone_id)) {
		    /* there was a bridge stone in between, but we found the link */
		    /* the bridge stone only exists because of this link, destroy it */
		    EVdfg_config_action dact;
		    dact.type = ACT_destroy;
		    dact.stone_id = possible_bridge->stone_id;
		    EVdfg_perform_act_on_state(config, dact, build_queue);
		    /* remove this link, move remaining down */
		    memmove(&src->out_links[i], &src->out_links[i+1], 
			    sizeof(src->out_links[0]) * (src->out_count - i - 1));
		    found++;
		    /* rewrite action to refer to link by position */
		    act.type = ACT_unlink_port;
		    act.u.link.port = i;
		}
	    }
	}
	if (found == 0) {
	    /* not found, error to unlink */
	    return 0;
	} 
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_set_attrs: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (stone->attrs != NULL) {
	    free_attr_list(stone->attrs);
	}
	stone->attrs = act.u.attrs.attrs;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_assign_node: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	stone->node = act.u.assign.dest_node;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_destroy: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    default:
	switch(act.type) {
	case ACT_no_op:
	case ACT_freeze:
	case ACT_unfreeze:
	    printf("Bad action in perform_act_on_state %s (%d)\n", ACT_string[act.type], act.type);
	    break;
	default:
	    printf("Bad action in perform_act_on_state %d\n", act.type);
	    break;
	}
	return 0;
    }
    return 1;
}